

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse41_128_16.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_table_diag_sse41_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  ushort uVar1;
  int *piVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint a;
  unkbyte10 Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined2 uVar12;
  undefined2 uVar13;
  undefined2 uVar14;
  undefined2 uVar15;
  undefined2 uVar16;
  undefined2 uVar17;
  undefined2 uVar18;
  undefined2 uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  parasail_result_t *ppVar23;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  long lVar24;
  short sVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  ulong uVar32;
  undefined8 unaff_RBP;
  short sVar33;
  int iVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  ulong uVar38;
  int16_t iVar39;
  uint uVar40;
  ulong uVar41;
  uint uVar42;
  uint uVar43;
  ulong uVar44;
  ulong uVar45;
  uint uVar46;
  undefined4 uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  short sVar59;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  short sVar69;
  undefined1 auVar64 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 in_XMM10 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar82 [16];
  ushort uVar83;
  ushort uVar85;
  ushort uVar86;
  ushort uVar87;
  ushort uVar88;
  ushort uVar89;
  ushort uVar90;
  ushort uVar91;
  undefined1 auVar84 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  __m128i vMaxHCol;
  __m128i vMaxHRow;
  short local_1d8;
  short sStack_1d6;
  long local_1c8;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined8 local_158;
  undefined8 uStack_150;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  long local_f0;
  int *local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  short sVar47;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar74;
  short sVar77;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_table_diag_sse41_128_16_cold_7();
    return (parasail_result_t *)0x0;
  }
  uVar45 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    parasail_sg_flags_table_diag_sse41_128_16_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sg_flags_table_diag_sse41_128_16_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sg_flags_table_diag_sse41_128_16_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sg_flags_table_diag_sse41_128_16_cold_3();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      parasail_sg_flags_table_diag_sse41_128_16_cold_2();
      return (parasail_result_t *)0x0;
    }
    uVar44 = (ulong)(uint)_s1Len;
    if (_s1Len < 1) {
      parasail_sg_flags_table_diag_sse41_128_16_cold_1();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    uVar44 = (ulong)(uint)matrix->length;
  }
  a = (uint)uVar44;
  iVar20 = a + 7;
  uVar46 = s2Len + 7;
  iVar34 = -open;
  iVar22 = matrix->min;
  iVar30 = -iVar22;
  if (iVar22 != iVar34 && SBORROW4(iVar22,iVar34) == iVar22 + open < 0) {
    iVar30 = open;
  }
  uVar29 = iVar30 - 0x7fff;
  iVar22 = matrix->max;
  auVar49 = pshuflw(ZEXT416(uVar29),ZEXT416(uVar29),0);
  uVar48 = auVar49._0_4_;
  local_1d8 = auVar49._0_2_;
  sStack_1d6 = auVar49._2_2_;
  local_b8 = 0;
  local_188 = (undefined1  [16])0x0;
  if (s1_beg == 0) {
    auVar49 = pshuflw(ZEXT416((uint)(gap * 8)),ZEXT416((uint)(gap * 8)),0);
    local_b8 = auVar49._0_4_;
  }
  local_108._0_8_ = CONCAT26(sStack_1d6,CONCAT24(local_1d8,uVar48));
  local_108._8_8_ = CONCAT26(sStack_1d6,CONCAT24(local_1d8,uVar48));
  local_118._8_8_ = local_108._8_8_;
  local_118._0_8_ = local_108._0_8_;
  local_128._8_8_ = local_108._8_8_;
  local_128._0_8_ = local_108._0_8_;
  local_178._8_8_ = local_108._8_8_;
  local_178._0_8_ = local_108._0_8_;
  local_138._8_8_ = local_108._8_8_;
  local_138._0_8_ = local_108._0_8_;
  uVar1 = (ushort)iVar34;
  sVar25 = (short)gap;
  if (s1_beg == 0) {
    local_188._8_8_ =
         (ulong)(uint)(gap * 0xfffd - open) & 0xffff | (ulong)(ushort)(uVar1 + sVar25 * -2) << 0x10
         | (ulong)(ushort)(uVar1 - sVar25) << 0x20 | (ulong)uVar1 << 0x30;
    local_188._0_8_ =
         (ulong)(uint)(gap * 0xfff9 - open) & 0xffffffff0000ffff |
         (ulong)(ushort)(sVar25 * -6 - (short)open) << 0x10 |
         (ulong)(ushort)(sVar25 * -5 - (short)open) << 0x20 |
         (ulong)(ushort)(uVar1 + sVar25 * -4) << 0x30;
  }
  uStack_b4 = local_b8;
  uStack_b0 = local_b8;
  uStack_ac = local_b8;
  ppVar23 = parasail_result_new_table1(a,s2Len);
  if (ppVar23 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar23->flag =
       (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
       (uint)(s2_end != 0) << 0xf | ppVar23->flag | 0x8221002;
  uVar31 = (ulong)(s2Len + 0xe);
  ptr = parasail_memalign_int16_t(0x10,uVar31);
  ptr_00 = parasail_memalign_int16_t(0x10,uVar31);
  ptr_01 = parasail_memalign_int16_t(0x10,uVar31);
  if (ptr_01 == (int16_t *)0x0 || (ptr_00 == (int16_t *)0x0 || ptr == (int16_t *)0x0)) {
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    ptr_02 = parasail_memalign_int16_t(0x10,(long)iVar20);
    if (ptr_02 == (int16_t *)0x0) {
      return (parasail_result_t *)0x0;
    }
    if (0 < (int)a) {
      piVar2 = matrix->mapper;
      uVar31 = 0;
      do {
        ptr_02[uVar31] = (int16_t)piVar2[(byte)_s1[uVar31]];
        uVar31 = uVar31 + 1;
      } while (uVar44 != uVar31);
    }
    iVar30 = a + 1;
    if ((int)(a + 1) < iVar20) {
      iVar30 = iVar20;
    }
    memset(ptr_02 + (int)a,0,(ulong)(~a + iVar30) * 2 + 2);
  }
  else {
    ptr_02 = (int16_t *)0x0;
  }
  auVar49 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_RBP >> 0x10),0x7ffe - (short)iVar22));
  auVar49 = pshuflw(auVar49,auVar49,0);
  auVar60 = pshuflw(ZEXT416(a),ZEXT416(a),0);
  auVar70 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
  local_168._0_4_ = auVar49._0_4_;
  local_168._4_4_ = local_168._0_4_;
  local_168._8_4_ = local_168._0_4_;
  local_168._12_4_ = local_168._0_4_;
  auVar49 = pshuflw(local_168,ZEXT416((uint)open),0);
  auVar72 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)gap),0);
  local_48._0_4_ = auVar60._0_4_;
  local_48._4_4_ = local_48._0_4_;
  local_48._8_4_ = local_48._0_4_;
  local_48._12_4_ = local_48._0_4_;
  auVar60._8_4_ = 0xffffffff;
  auVar60._0_8_ = 0xffffffffffffffff;
  auVar60._12_4_ = 0xffffffff;
  local_68._0_4_ = auVar70._0_4_;
  local_68._4_4_ = local_68._0_4_;
  local_68._8_4_ = local_68._0_4_;
  local_68._12_4_ = local_68._0_4_;
  local_78 = auVar49._0_4_;
  local_88 = auVar72._0_4_;
  local_98 = paddsw(local_48,auVar60);
  local_58 = paddsw(auVar60,local_68);
  piVar2 = matrix->mapper;
  uVar31 = 1;
  if (1 < s2Len) {
    uVar31 = uVar45;
  }
  uVar32 = 0;
  do {
    ptr[uVar32 + 7] = (int16_t)piVar2[(byte)_s2[uVar32]];
    uVar32 = uVar32 + 1;
  } while (uVar31 != uVar32);
  ptr[3] = 0;
  ptr[4] = 0;
  ptr[5] = 0;
  ptr[6] = 0;
  ptr[0] = 0;
  ptr[1] = 0;
  ptr[2] = 0;
  ptr[3] = 0;
  uVar26 = s2Len + 1U;
  if ((int)(s2Len + 1U) < (int)uVar46) {
    uVar26 = uVar46;
  }
  uStack_84 = local_88;
  uStack_80 = local_88;
  uStack_7c = local_88;
  uStack_74 = local_78;
  uStack_70 = local_78;
  uStack_6c = local_78;
  memset(ptr + uVar45 + 7,0,(ulong)(~s2Len + uVar26) * 2 + 2);
  uVar31 = 1;
  if (1 < s2Len) {
    uVar31 = uVar45;
  }
  uVar32 = 0;
  iVar39 = (int16_t)uVar29;
  iVar22 = iVar34;
  if (s2_beg == 0) {
    do {
      ptr_00[uVar32 + 7] = (int16_t)iVar22;
      ptr_01[uVar32 + 7] = iVar39;
      uVar32 = uVar32 + 1;
      iVar22 = iVar22 - gap;
    } while (uVar31 != uVar32);
  }
  else {
    do {
      ptr_00[uVar32 + 7] = 0;
      ptr_01[uVar32 + 7] = iVar39;
      uVar32 = uVar32 + 1;
    } while (uVar31 != uVar32);
  }
  lVar24 = 0;
  do {
    ptr_00[lVar24] = iVar39;
    ptr_01[lVar24] = iVar39;
    lVar24 = lVar24 + 1;
  } while (lVar24 != 7);
  lVar24 = uVar45 + 7;
  uVar31 = uVar45;
  do {
    ptr_00[lVar24] = iVar39;
    ptr_01[lVar24] = iVar39;
    lVar24 = lVar24 + 1;
    uVar26 = (int)uVar31 + 1;
    uVar31 = (ulong)uVar26;
  } while ((int)uVar26 < (int)uVar46);
  ptr_00[6] = 0;
  uVar12 = local_168._0_2_;
  uVar13 = local_168._2_2_;
  uVar14 = local_168._4_2_;
  uVar15 = local_168._6_2_;
  uVar16 = local_168._8_2_;
  uVar17 = local_168._10_2_;
  uVar18 = local_168._12_2_;
  uVar19 = local_168._14_2_;
  sVar59 = local_1d8;
  sVar74 = sStack_1d6;
  sVar77 = local_1d8;
  sVar65 = sStack_1d6;
  sVar66 = local_1d8;
  sVar67 = sStack_1d6;
  sVar68 = local_1d8;
  sVar69 = sStack_1d6;
  sVar47 = local_168._0_2_;
  sVar52 = local_168._2_2_;
  sVar53 = local_168._4_2_;
  sVar54 = local_168._6_2_;
  sVar55 = local_168._8_2_;
  sVar56 = local_168._10_2_;
  sVar57 = local_168._12_2_;
  sVar58 = local_168._14_2_;
  if (0 < (int)a) {
    local_e8 = matrix->matrix;
    uVar26 = a - 1;
    Var9 = CONCAT28(local_1d8,CONCAT26(sStack_1d6,CONCAT24(local_1d8,uVar48)));
    auVar49._10_2_ = sStack_1d6;
    auVar49._0_10_ = Var9;
    auVar49._12_2_ = local_1d8;
    auVar49._14_2_ = sStack_1d6;
    local_a8 = auVar49 >> 0x10;
    auVar60 = local_a8;
    local_e0 = 1;
    if (1 < (int)uVar46) {
      local_e0 = (ulong)uVar46;
    }
    local_f0 = uVar45 * 0x20;
    local_190 = uVar45 * 4 + -4;
    local_1a0 = uVar45 * 0x1c + -0x1c;
    local_1a8 = uVar45 * 0x18 + -0x18;
    local_1b0 = uVar45 * 0x14 + -0x14;
    local_1b8 = uVar45 * 8 + -8;
    local_1c0 = uVar45 * 0x10 + -0x10;
    local_1c8 = uVar45 * 0xc + -0xc;
    auVar70 = pmovsxbw(in_XMM10,0x1020304050607);
    local_198 = 0;
    uVar31 = 0;
    local_158 = local_168._0_8_;
    uStack_150 = local_168._8_8_;
    local_148 = auVar49;
    do {
      iVar22 = matrix->type;
      uVar27 = (uint)uVar31;
      uVar46 = uVar27;
      if (iVar22 == 0) {
        uVar46 = (uint)ptr_02[uVar31];
      }
      uVar32 = uVar31 | 1;
      if (iVar22 == 0) {
        uVar35 = (int)ptr_02[uVar32];
      }
      else {
        uVar35 = uVar26;
        if (uVar32 < uVar44) {
          uVar35 = uVar27 | 1;
        }
      }
      uVar38 = uVar31 | 2;
      if (iVar22 == 0) {
        uVar40 = (int)ptr_02[uVar38];
      }
      else {
        uVar40 = uVar26;
        if (uVar38 < uVar44) {
          uVar40 = uVar27 | 2;
        }
      }
      uVar41 = uVar31 | 3;
      if (iVar22 == 0) {
        uVar42 = (int)ptr_02[uVar41];
      }
      else {
        uVar42 = uVar26;
        if (uVar41 < uVar44) {
          uVar42 = uVar27 | 3;
        }
      }
      local_c0 = uVar31 | 4;
      if (iVar22 == 0) {
        uVar43 = (int)ptr_02[local_c0];
      }
      else {
        uVar43 = uVar26;
        if (local_c0 < uVar44) {
          uVar43 = uVar27 | 4;
        }
      }
      local_c8 = uVar31 | 5;
      if (iVar22 == 0) {
        uVar36 = (int)ptr_02[local_c8];
      }
      else {
        uVar36 = uVar26;
        if (local_c8 < uVar44) {
          uVar36 = uVar27 | 5;
        }
      }
      local_d0 = uVar31 | 6;
      if (iVar22 == 0) {
        uVar37 = (int)ptr_02[local_d0];
      }
      else {
        uVar37 = uVar26;
        if (local_d0 < uVar44) {
          uVar37 = uVar27 | 6;
        }
      }
      iVar30 = matrix->size;
      local_d8 = uVar31 | 7;
      if (iVar22 == 0) {
        uVar21 = (int)ptr_02[local_d8];
      }
      else {
        uVar21 = uVar26;
        if (local_d8 < uVar44) {
          uVar21 = uVar27 | 7;
        }
      }
      uVar31 = uVar31 + 8;
      local_a8._0_8_ = (undefined8)((unkuint10)Var9 >> 0x10);
      local_a8._8_8_ = auVar49._8_8_ >> 0x10;
      auVar72._8_8_ = local_a8._8_8_ | (ulong)(ushort)ptr_00[6] << 0x30;
      auVar72._0_8_ = local_a8._0_8_;
      ptr_00[6] = uVar1 - (short)uVar31 * sVar25;
      uVar27 = iVar34 - uVar27 * gap;
      if (s1_beg != 0) {
        uVar27 = 0;
      }
      auVar93._8_8_ = local_a8._8_8_ | (ulong)uVar27 << 0x30;
      auVar93._0_8_ = local_a8._0_8_;
      auVar92._0_2_ = -(ushort)(local_98._0_2_ == auVar70._0_2_);
      auVar92._2_2_ = -(ushort)(local_98._2_2_ == auVar70._2_2_);
      auVar92._4_2_ = -(ushort)(local_98._4_2_ == auVar70._4_2_);
      auVar92._6_2_ = -(ushort)(local_98._6_2_ == auVar70._6_2_);
      auVar92._8_2_ = -(ushort)(local_98._8_2_ == auVar70._8_2_);
      auVar92._10_2_ = -(ushort)(local_98._10_2_ == auVar70._10_2_);
      auVar92._12_2_ = -(ushort)(local_98._12_2_ == auVar70._12_2_);
      auVar92._14_2_ = -(ushort)(local_98._14_2_ == auVar70._14_2_);
      uVar28 = 0;
      in_XMM11 = pmovsxbw(in_XMM11,0xfffefdfcfbfaf9);
      auVar75._4_2_ = local_1d8;
      auVar75._0_4_ = uVar48;
      auVar75._6_2_ = sStack_1d6;
      auVar75._8_2_ = local_1d8;
      auVar75._10_2_ = sStack_1d6;
      auVar75._12_2_ = local_1d8;
      auVar75._14_2_ = sStack_1d6;
      auVar81 = auVar75;
      do {
        auVar79._10_2_ = (short)local_e8[(long)(int)(uVar40 * iVar30) + (long)ptr[uVar28 + 5]];
        auVar79._8_2_ = (short)local_e8[(long)(int)(uVar42 * iVar30) + (long)ptr[uVar28 + 4]];
        auVar79._12_2_ = (short)local_e8[(long)(int)(uVar35 * iVar30) + (long)ptr[uVar28 + 6]];
        auVar79._14_2_ = (short)local_e8[(long)(int)(uVar46 * iVar30) + (long)ptr[uVar28 + 7]];
        auVar79._0_8_ =
             (ulong)(uint)local_e8[(long)(int)(uVar21 * iVar30) + (long)ptr[uVar28]] &
             0xffffffff0000ffff |
             (ulong)*(ushort *)(local_e8 + (long)(int)(uVar37 * iVar30) + (long)ptr[uVar28 + 1]) <<
             0x10 | (ulong)*(ushort *)
                            (local_e8 + (long)(int)(uVar36 * iVar30) + (long)ptr[uVar28 + 2]) <<
                    0x20 |
             (ulong)*(ushort *)(local_e8 + (long)(int)(uVar43 * iVar30) + (long)ptr[uVar28 + 3]) <<
             0x30;
        auVar82._0_8_ = auVar93._2_8_;
        auVar82._8_8_ = auVar93._8_8_ >> 0x10 | (ulong)(ushort)ptr_00[uVar28 + 7] << 0x30;
        auVar72 = paddsw(auVar79,auVar72);
        auVar78._0_8_ = auVar81._2_8_;
        auVar78._8_8_ = auVar81._8_8_ >> 0x10 | (ulong)(ushort)ptr_01[uVar28 + 7] << 0x30;
        auVar11._4_4_ = uStack_74;
        auVar11._0_4_ = local_78;
        auVar11._8_4_ = uStack_70;
        auVar11._12_4_ = uStack_6c;
        auVar61 = psubsw(auVar82,auVar11);
        auVar81._4_4_ = uStack_84;
        auVar81._0_4_ = local_88;
        auVar81._8_4_ = uStack_80;
        auVar81._12_4_ = uStack_7c;
        auVar79 = psubsw(auVar78,auVar81);
        sVar59 = auVar61._0_2_;
        sVar74 = auVar79._0_2_;
        auVar80._0_2_ = (ushort)(sVar74 < sVar59) * sVar59 | (ushort)(sVar74 >= sVar59) * sVar74;
        sVar59 = auVar61._2_2_;
        sVar74 = auVar79._2_2_;
        auVar80._2_2_ = (ushort)(sVar74 < sVar59) * sVar59 | (ushort)(sVar74 >= sVar59) * sVar74;
        sVar59 = auVar61._4_2_;
        sVar74 = auVar79._4_2_;
        auVar80._4_2_ = (ushort)(sVar74 < sVar59) * sVar59 | (ushort)(sVar74 >= sVar59) * sVar74;
        sVar59 = auVar61._6_2_;
        sVar74 = auVar79._6_2_;
        auVar80._6_2_ = (ushort)(sVar74 < sVar59) * sVar59 | (ushort)(sVar74 >= sVar59) * sVar74;
        sVar59 = auVar61._8_2_;
        sVar74 = auVar79._8_2_;
        auVar80._8_2_ = (ushort)(sVar74 < sVar59) * sVar59 | (ushort)(sVar74 >= sVar59) * sVar74;
        sVar59 = auVar61._10_2_;
        sVar74 = auVar79._10_2_;
        auVar80._10_2_ = (ushort)(sVar74 < sVar59) * sVar59 | (ushort)(sVar74 >= sVar59) * sVar74;
        sVar59 = auVar61._12_2_;
        sVar74 = auVar79._12_2_;
        sVar77 = auVar79._14_2_;
        auVar80._12_2_ = (ushort)(sVar74 < sVar59) * sVar59 | (ushort)(sVar74 >= sVar59) * sVar74;
        sVar59 = auVar61._14_2_;
        auVar80._14_2_ = (ushort)(sVar77 < sVar59) * sVar59 | (ushort)(sVar77 >= sVar59) * sVar77;
        auVar93 = psubsw(auVar93,auVar11);
        auVar75 = psubsw(auVar75,auVar81);
        sVar59 = auVar93._0_2_;
        sVar74 = auVar75._0_2_;
        auVar76._0_2_ = (ushort)(sVar74 < sVar59) * sVar59 | (ushort)(sVar74 >= sVar59) * sVar74;
        sVar59 = auVar93._2_2_;
        sVar74 = auVar75._2_2_;
        auVar76._2_2_ = (ushort)(sVar74 < sVar59) * sVar59 | (ushort)(sVar74 >= sVar59) * sVar74;
        sVar59 = auVar93._4_2_;
        sVar74 = auVar75._4_2_;
        auVar76._4_2_ = (ushort)(sVar74 < sVar59) * sVar59 | (ushort)(sVar74 >= sVar59) * sVar74;
        sVar59 = auVar93._6_2_;
        sVar74 = auVar75._6_2_;
        auVar76._6_2_ = (ushort)(sVar74 < sVar59) * sVar59 | (ushort)(sVar74 >= sVar59) * sVar74;
        sVar59 = auVar93._8_2_;
        sVar74 = auVar75._8_2_;
        auVar76._8_2_ = (ushort)(sVar74 < sVar59) * sVar59 | (ushort)(sVar74 >= sVar59) * sVar74;
        sVar59 = auVar93._10_2_;
        sVar74 = auVar75._10_2_;
        auVar76._10_2_ = (ushort)(sVar74 < sVar59) * sVar59 | (ushort)(sVar74 >= sVar59) * sVar74;
        sVar59 = auVar93._12_2_;
        sVar74 = auVar75._12_2_;
        sVar77 = auVar75._14_2_;
        auVar76._12_2_ = (ushort)(sVar74 < sVar59) * sVar59 | (ushort)(sVar74 >= sVar59) * sVar74;
        sVar59 = auVar93._14_2_;
        auVar76._14_2_ = (ushort)(sVar77 < sVar59) * sVar59 | (ushort)(sVar77 >= sVar59) * sVar77;
        uVar83 = ((short)auVar76._0_2_ < (short)auVar80._0_2_) * auVar80._0_2_ |
                 ((short)auVar76._0_2_ >= (short)auVar80._0_2_) * auVar76._0_2_;
        uVar85 = ((short)auVar76._2_2_ < (short)auVar80._2_2_) * auVar80._2_2_ |
                 ((short)auVar76._2_2_ >= (short)auVar80._2_2_) * auVar76._2_2_;
        uVar86 = ((short)auVar76._4_2_ < (short)auVar80._4_2_) * auVar80._4_2_ |
                 ((short)auVar76._4_2_ >= (short)auVar80._4_2_) * auVar76._4_2_;
        uVar87 = ((short)auVar76._6_2_ < (short)auVar80._6_2_) * auVar80._6_2_ |
                 ((short)auVar76._6_2_ >= (short)auVar80._6_2_) * auVar76._6_2_;
        uVar88 = ((short)auVar76._8_2_ < (short)auVar80._8_2_) * auVar80._8_2_ |
                 ((short)auVar76._8_2_ >= (short)auVar80._8_2_) * auVar76._8_2_;
        uVar89 = ((short)auVar76._10_2_ < (short)auVar80._10_2_) * auVar80._10_2_ |
                 ((short)auVar76._10_2_ >= (short)auVar80._10_2_) * auVar76._10_2_;
        uVar90 = ((short)auVar76._12_2_ < (short)auVar80._12_2_) * auVar80._12_2_ |
                 ((short)auVar76._12_2_ >= (short)auVar80._12_2_) * auVar76._12_2_;
        uVar91 = ((short)auVar76._14_2_ < (short)auVar80._14_2_) * auVar80._14_2_ |
                 ((short)auVar76._14_2_ >= (short)auVar80._14_2_) * auVar76._14_2_;
        sVar59 = auVar72._0_2_;
        auVar84._0_2_ =
             (ushort)((short)uVar83 < sVar59) * sVar59 | ((short)uVar83 >= sVar59) * uVar83;
        sVar59 = auVar72._2_2_;
        auVar84._2_2_ =
             (ushort)((short)uVar85 < sVar59) * sVar59 | ((short)uVar85 >= sVar59) * uVar85;
        sVar59 = auVar72._4_2_;
        auVar84._4_2_ =
             (ushort)((short)uVar86 < sVar59) * sVar59 | ((short)uVar86 >= sVar59) * uVar86;
        sVar59 = auVar72._6_2_;
        auVar84._6_2_ =
             (ushort)((short)uVar87 < sVar59) * sVar59 | ((short)uVar87 >= sVar59) * uVar87;
        sVar59 = auVar72._8_2_;
        auVar84._8_2_ =
             (ushort)((short)uVar88 < sVar59) * sVar59 | ((short)uVar88 >= sVar59) * uVar88;
        sVar59 = auVar72._10_2_;
        auVar84._10_2_ =
             (ushort)((short)uVar89 < sVar59) * sVar59 | ((short)uVar89 >= sVar59) * uVar89;
        sVar59 = auVar72._12_2_;
        auVar84._12_2_ =
             (ushort)((short)uVar90 < sVar59) * sVar59 | ((short)uVar90 >= sVar59) * uVar90;
        sVar59 = auVar72._14_2_;
        auVar84._14_2_ =
             (ushort)((short)uVar91 < sVar59) * sVar59 | ((short)uVar91 >= sVar59) * uVar91;
        sVar47 = in_XMM11._0_2_;
        auVar50._0_2_ = -(ushort)(sVar47 == -1);
        sVar52 = in_XMM11._2_2_;
        auVar50._2_2_ = -(ushort)(sVar52 == -1);
        sVar53 = in_XMM11._4_2_;
        auVar50._4_2_ = -(ushort)(sVar53 == -1);
        sVar54 = in_XMM11._6_2_;
        auVar50._6_2_ = -(ushort)(sVar54 == -1);
        sVar55 = in_XMM11._8_2_;
        auVar50._8_2_ = -(ushort)(sVar55 == -1);
        sVar56 = in_XMM11._10_2_;
        auVar50._10_2_ = -(ushort)(sVar56 == -1);
        sVar57 = in_XMM11._12_2_;
        sVar58 = in_XMM11._14_2_;
        auVar50._12_2_ = -(ushort)(sVar57 == -1);
        auVar50._14_2_ = -(ushort)(sVar58 == -1);
        auVar93 = pblendvb(auVar84,local_188,auVar50);
        auVar61._4_2_ = local_1d8;
        auVar61._0_4_ = uVar48;
        auVar61._6_2_ = sStack_1d6;
        auVar61._8_2_ = local_1d8;
        auVar61._10_2_ = sStack_1d6;
        auVar61._12_2_ = local_1d8;
        auVar61._14_2_ = sStack_1d6;
        auVar81 = pblendvb(auVar80,auVar61,auVar50);
        auVar75 = pblendvb(auVar76,auVar61,auVar50);
        sVar59 = auVar93._0_2_;
        sVar74 = auVar93._2_2_;
        sVar69 = auVar93._14_2_;
        sVar66 = auVar93._8_2_;
        sVar67 = auVar93._10_2_;
        sVar68 = auVar93._12_2_;
        sVar77 = auVar93._4_2_;
        sVar65 = auVar93._6_2_;
        if (7 < uVar28) {
          bVar3 = sVar59 < (short)local_158;
          uVar83 = (ushort)!bVar3 * (short)local_158;
          bVar4 = sVar74 < local_158._2_2_;
          uVar85 = (ushort)!bVar4 * local_158._2_2_;
          bVar5 = sVar77 < local_158._4_2_;
          uVar86 = (ushort)!bVar5 * local_158._4_2_;
          bVar6 = sVar66 < (short)uStack_150;
          uVar87 = (ushort)!bVar6 * (short)uStack_150;
          bVar7 = sVar67 < uStack_150._2_2_;
          uVar88 = (ushort)!bVar7 * uStack_150._2_2_;
          bVar8 = sVar68 < uStack_150._4_2_;
          uVar89 = (ushort)!bVar8 * uStack_150._4_2_;
          local_158 = CONCAT26((ushort)(sVar65 < local_158._6_2_) * sVar65 |
                               (ushort)(sVar65 >= local_158._6_2_) * local_158._6_2_,
                               CONCAT24((ushort)bVar5 * sVar77 | uVar86,
                                        CONCAT22((ushort)bVar4 * sVar74 | uVar85,
                                                 (ushort)bVar3 * sVar59 | uVar83)));
          uStack_150 = CONCAT26((ushort)(sVar69 < uStack_150._6_2_) * sVar69 |
                                (ushort)(sVar69 >= uStack_150._6_2_) * uStack_150._6_2_,
                                CONCAT24((ushort)bVar8 * sVar68 | uVar89,
                                         CONCAT22((ushort)bVar7 * sVar67 | uVar88,
                                                  (ushort)bVar6 * sVar66 | uVar87)));
          local_148._2_2_ =
               (ushort)((short)local_148._2_2_ < sVar74) * sVar74 |
               (ushort)((short)local_148._2_2_ >= sVar74) * local_148._2_2_;
          local_148._0_2_ =
               (ushort)((short)local_148._0_2_ < sVar59) * sVar59 |
               (ushort)((short)local_148._0_2_ >= sVar59) * local_148._0_2_;
          local_148._4_2_ =
               (ushort)((short)local_148._4_2_ < sVar77) * sVar77 |
               (ushort)((short)local_148._4_2_ >= sVar77) * local_148._4_2_;
          local_148._6_2_ =
               (ushort)((short)local_148._6_2_ < sVar65) * sVar65 |
               (ushort)((short)local_148._6_2_ >= sVar65) * local_148._6_2_;
          local_148._8_2_ =
               (ushort)((short)local_148._8_2_ < sVar66) * sVar66 |
               (ushort)((short)local_148._8_2_ >= sVar66) * local_148._8_2_;
          local_148._10_2_ =
               (ushort)((short)local_148._10_2_ < sVar67) * sVar67 |
               (ushort)((short)local_148._10_2_ >= sVar67) * local_148._10_2_;
          local_148._12_2_ =
               (ushort)((short)local_148._12_2_ < sVar68) * sVar68 |
               (ushort)((short)local_148._12_2_ >= sVar68) * local_148._12_2_;
          local_148._14_2_ =
               (ushort)((short)local_148._14_2_ < sVar69) * sVar69 |
               (ushort)((short)local_148._14_2_ >= sVar69) * local_148._14_2_;
        }
        piVar2 = ((ppVar23->field_4).rowcols)->score_row;
        if (uVar28 < uVar45) {
          *(int *)((long)piVar2 + uVar28 * 4 + local_198) = (int)sVar69;
        }
        if (uVar28 - 1 < uVar45 && uVar32 < uVar44) {
          *(int *)((long)piVar2 + uVar28 * 4 + local_190) = (int)sVar68;
        }
        if ((uVar38 < uVar44) && ((long)(uVar28 - 2) < (long)uVar45 && 1 < uVar28)) {
          *(int *)((long)piVar2 + uVar28 * 4 + local_1b8) = (int)sVar67;
        }
        if ((uVar41 < uVar44) && ((long)(uVar28 - 3) < (long)uVar45 && 2 < uVar28)) {
          *(int *)((long)piVar2 + uVar28 * 4 + local_1c8) = (int)sVar66;
        }
        if ((local_c0 < uVar44) && ((long)(uVar28 - 4) < (long)uVar45 && 3 < uVar28)) {
          *(int *)((long)piVar2 + uVar28 * 4 + local_1c0) = (int)sVar65;
        }
        if ((local_c8 < uVar44) && ((long)(uVar28 - 5) < (long)uVar45 && 4 < uVar28)) {
          *(int *)((long)piVar2 + uVar28 * 4 + local_1b0) = (int)sVar77;
        }
        if ((local_d0 < uVar44) && ((long)(uVar28 - 6) < (long)uVar45 && 5 < uVar28)) {
          *(int *)((long)piVar2 + uVar28 * 4 + local_1a8) = (int)sVar74;
        }
        if ((local_d8 < uVar44) && ((long)(uVar28 - 7) < (long)uVar45 && 6 < uVar28)) {
          *(int *)((long)piVar2 + uVar28 * 4 + local_1a0) = (int)sVar59;
        }
        ptr_00[uVar28] = sVar59;
        ptr_01[uVar28] = auVar81._0_2_;
        auVar62._0_2_ = -(ushort)(auVar70._0_2_ < (short)local_48._0_2_);
        auVar62._2_2_ = -(ushort)(auVar70._2_2_ < (short)local_48._2_2_);
        auVar62._4_2_ = -(ushort)(auVar70._4_2_ < (short)local_48._4_2_);
        auVar62._6_2_ = -(ushort)(auVar70._6_2_ < (short)local_48._6_2_);
        auVar62._8_2_ = -(ushort)(auVar70._8_2_ < (short)local_48._8_2_);
        auVar62._10_2_ = -(ushort)(auVar70._10_2_ < (short)local_48._10_2_);
        auVar62._12_2_ = -(ushort)(auVar70._12_2_ < (short)local_48._12_2_);
        auVar62._14_2_ = -(ushort)(auVar70._14_2_ < (short)local_48._14_2_);
        auVar71._0_2_ = -(ushort)(local_58._0_2_ == sVar47);
        auVar71._2_2_ = -(ushort)(local_58._2_2_ == sVar52);
        auVar71._4_2_ = -(ushort)(local_58._4_2_ == sVar53);
        auVar71._6_2_ = -(ushort)(local_58._6_2_ == sVar54);
        auVar71._8_2_ = -(ushort)(local_58._8_2_ == sVar55);
        auVar71._10_2_ = -(ushort)(local_58._10_2_ == sVar56);
        auVar71._12_2_ = -(ushort)(local_58._12_2_ == sVar57);
        auVar71._14_2_ = -(ushort)(local_58._14_2_ == sVar58);
        auVar51._0_2_ = -(ushort)(sVar47 < (short)local_68._0_2_);
        auVar51._2_2_ = -(ushort)(sVar52 < (short)local_68._2_2_);
        auVar51._4_2_ = -(ushort)(sVar53 < (short)local_68._4_2_);
        auVar51._6_2_ = -(ushort)(sVar54 < (short)local_68._6_2_);
        auVar51._8_2_ = -(ushort)(sVar55 < (short)local_68._8_2_);
        auVar51._10_2_ = -(ushort)(sVar56 < (short)local_68._10_2_);
        auVar51._12_2_ = -(ushort)(sVar57 < (short)local_68._12_2_);
        auVar51._14_2_ = -(ushort)(sVar58 < (short)local_68._14_2_);
        auVar72 = psraw(in_XMM11,0xf);
        auVar73._0_2_ = -(ushort)(local_108._0_2_ < sVar59);
        auVar73._2_2_ = -(ushort)(local_108._2_2_ < sVar74);
        auVar73._4_2_ = -(ushort)(local_108._4_2_ < sVar77);
        auVar73._6_2_ = -(ushort)(local_108._6_2_ < sVar65);
        auVar73._8_2_ = -(ushort)(local_108._8_2_ < sVar66);
        auVar73._10_2_ = -(ushort)(local_108._10_2_ < sVar67);
        auVar73._12_2_ = -(ushort)(local_108._12_2_ < sVar68);
        auVar73._14_2_ = -(ushort)(local_108._14_2_ < sVar69);
        auVar73 = ~auVar72 & auVar51 & auVar92 & auVar73;
        local_108 = pblendvb(local_108,auVar84,auVar73);
        auVar63._0_2_ = -(ushort)(local_118._0_2_ < sVar59);
        auVar63._2_2_ = -(ushort)(local_118._2_2_ < sVar74);
        auVar63._4_2_ = -(ushort)(local_118._4_2_ < sVar77);
        auVar63._6_2_ = -(ushort)(local_118._6_2_ < sVar65);
        auVar63._8_2_ = -(ushort)(local_118._8_2_ < sVar66);
        auVar63._10_2_ = -(ushort)(local_118._10_2_ < sVar67);
        auVar63._12_2_ = -(ushort)(local_118._12_2_ < sVar68);
        auVar63._14_2_ = -(ushort)(local_118._14_2_ < sVar69);
        auVar63 = auVar62 & auVar71 & auVar63;
        local_118 = pblendvb(local_118,auVar93,auVar63);
        local_128 = pblendvb(local_128,auVar93,auVar71 & auVar92);
        local_178 = pblendvb(local_178,auVar70,auVar63);
        local_138 = pblendvb(local_138,in_XMM11,auVar73);
        in_XMM11 = paddsw(in_XMM11,_DAT_008d0b80);
        uVar28 = uVar28 + 1;
        auVar72 = auVar82;
      } while (local_e0 != uVar28);
      auVar70 = paddsw(auVar70,_DAT_008d0b90);
      auVar10._4_4_ = uStack_b4;
      auVar10._0_4_ = local_b8;
      auVar10._8_4_ = uStack_b0;
      auVar10._12_4_ = uStack_ac;
      local_188 = psubsw(local_188,auVar10);
      local_198 = local_198 + local_f0;
      local_190 = local_190 + local_f0;
      local_1a0 = local_1a0 + local_f0;
      local_1a8 = local_1a8 + local_f0;
      local_1b0 = local_1b0 + local_f0;
      local_1c0 = local_1c0 + local_f0;
      local_1c8 = local_1c8 + local_f0;
      local_1b8 = local_1b8 + local_f0;
    } while (uVar31 < uVar44);
    sVar59 = local_148._0_2_;
    sVar74 = local_148._2_2_;
    sVar77 = local_148._4_2_;
    sVar65 = local_148._6_2_;
    sVar66 = local_148._8_2_;
    sVar67 = local_148._10_2_;
    sVar68 = local_148._12_2_;
    sVar69 = local_148._14_2_;
    sVar47 = (short)local_158;
    sVar52 = local_158._2_2_;
    sVar53 = local_158._4_2_;
    sVar54 = local_158._6_2_;
    sVar55 = (short)uStack_150;
    sVar56 = uStack_150._2_2_;
    sVar57 = uStack_150._4_2_;
    sVar58 = uStack_150._6_2_;
    local_a8 = auVar60;
  }
  lVar24 = 0;
  iVar30 = 0;
  iVar22 = 0;
  uVar46 = uVar29;
  uVar26 = uVar29;
  do {
    uVar1 = *(ushort *)(local_118 + lVar24 * 2);
    if (((short)(ushort)uVar46 < (short)uVar1) ||
       ((uVar1 == (ushort)uVar46 && (*(short *)(local_178 + lVar24 * 2) < iVar30)))) {
      iVar30 = (int)*(short *)(local_178 + lVar24 * 2);
      uVar46 = (uint)uVar1;
    }
    sVar25 = (short)uVar46;
    if ((short)uVar26 < (short)*(ushort *)(local_108 + lVar24 * 2)) {
      iVar22 = (int)*(short *)(local_138 + lVar24 * 2);
      uVar26 = (uint)*(ushort *)(local_108 + lVar24 * 2);
    }
    sVar33 = (short)uVar26;
    uVar27 = (uint)*(ushort *)(local_128 + lVar24 * 2);
    if ((short)*(ushort *)(local_128 + lVar24 * 2) <= (short)uVar29) {
      uVar27 = uVar29;
    }
    uVar29 = uVar27;
    lVar24 = lVar24 + 1;
  } while ((int)lVar24 != 8);
  if (s1_end == 0 || s2_end == 0) {
    if (s1_end == 0) {
      iVar30 = a - 1;
      iVar20 = s2Len + -1;
      sVar25 = (short)uVar29;
      if (s2_end != 0) {
        iVar20 = iVar22;
        sVar25 = sVar33;
      }
      goto LAB_0069cc62;
    }
  }
  else if ((sVar25 <= sVar33) && ((sVar25 != sVar33 || (iVar22 != s2Len + -1)))) {
    iVar30 = a - 1;
    iVar20 = iVar22;
    sVar25 = sVar33;
    goto LAB_0069cc62;
  }
  iVar20 = s2Len + -1;
LAB_0069cc62:
  auVar70._0_2_ = -(ushort)(sVar47 < local_1d8);
  auVar70._2_2_ = -(ushort)(sVar52 < sStack_1d6);
  auVar70._4_2_ = -(ushort)(sVar53 < local_1d8);
  auVar70._6_2_ = -(ushort)(sVar54 < sStack_1d6);
  auVar70._8_2_ = -(ushort)(sVar55 < local_1d8);
  auVar70._10_2_ = -(ushort)(sVar56 < sStack_1d6);
  auVar70._12_2_ = -(ushort)(sVar57 < local_1d8);
  auVar70._14_2_ = -(ushort)(sVar58 < sStack_1d6);
  auVar64._0_2_ = -(ushort)((short)uVar12 < sVar59);
  auVar64._2_2_ = -(ushort)((short)uVar13 < sVar74);
  auVar64._4_2_ = -(ushort)((short)uVar14 < sVar77);
  auVar64._6_2_ = -(ushort)((short)uVar15 < sVar65);
  auVar64._8_2_ = -(ushort)((short)uVar16 < sVar66);
  auVar64._10_2_ = -(ushort)((short)uVar17 < sVar67);
  auVar64._12_2_ = -(ushort)((short)uVar18 < sVar68);
  auVar64._14_2_ = -(ushort)((short)uVar19 < sVar69);
  auVar64 = auVar64 | auVar70;
  if ((((((((((((((((auVar64 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar64 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar64 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar64 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar64 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar64 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar64 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar64 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar64 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar64 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar64 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar64 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar64[0xf] < '\0') {
    *(byte *)&ppVar23->flag = (byte)ppVar23->flag | 0x40;
    sVar25 = 0;
    iVar20 = 0;
    iVar30 = 0;
  }
  ppVar23->score = (int)sVar25;
  ppVar23->end_query = iVar30;
  ppVar23->end_ref = iVar20;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(ptr_02);
    return ppVar23;
  }
  return ppVar23;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vGapN = s1_beg ? _mm_set1_epi16(0) : _mm_set1_epi16(gap*N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vILimit1 = _mm_subs_epi16(vILimit, vOne);
    vJLimit = _mm_set1_epi16(s2Len);
    vJLimit1 = _mm_subs_epi16(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi16(0) : _mm_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m128i vIltLimit = _mm_cmplt_epi16(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi16(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 2);
        vNH = _mm_insert_epi16(vNH, H_pr[-1], 7);
        vWH = _mm_srli_si128(vWH, 2);
        vWH = _mm_insert_epi16(vWH, s1_beg ? 0 : (-open - i*gap), 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vNH, vOpen),
                    _mm_subs_epi16(vF, vGap));
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vWH, vOpen),
                    _mm_subs_epi16(vE, vGap));
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi16(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi16(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi16(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi16(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi16(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
        vIBoundary = _mm_subs_epi16(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int16_t max_row = NEG_LIMIT;
        int16_t max_col = NEG_LIMIT;
        int16_t last_val = NEG_LIMIT;
        int16_t *s = (int16_t*)&vMaxHRow;
        int16_t *t = (int16_t*)&vMaxHCol;
        int16_t *u = (int16_t*)&vLastVal;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}